

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O1

void NextContext(CPpmd7 *p)

{
  uint *puVar1;
  Byte BVar2;
  byte bVar3;
  undefined2 uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  undefined4 uVar9;
  uint uVar10;
  CPpmd_State *pCVar11;
  Byte *pBVar12;
  int iVar13;
  byte bVar14;
  CPpmd7_Context *pCVar15;
  ulong uVar16;
  CTX_PTR_conflict pCVar17;
  undefined4 *puVar18;
  void *pvVar19;
  uint uVar20;
  Byte *pBVar21;
  Byte *pBVar22;
  CPpmd_Void_Ref *pCVar23;
  short sVar24;
  long lVar25;
  short sVar26;
  uint uVar27;
  uint uVar28;
  CPpmd7_Context *pCVar29;
  ulong uVar30;
  uint uStack_5c;
  
  if ((p->OrderFall == 0) &&
     (uVar28._0_2_ = p->FoundState->SuccessorLow, uVar28._2_2_ = p->FoundState->SuccessorHigh,
     pCVar15 = (CPpmd7_Context *)(p->Base + uVar28), (CPpmd7_Context *)p->Text < pCVar15)) {
    p->MaxContext = pCVar15;
    p->MinContext = pCVar15;
    return;
  }
  pCVar11 = p->FoundState;
  uStack_5c._0_2_ = pCVar11->SuccessorLow;
  uStack_5c._2_2_ = pCVar11->SuccessorHigh;
  if ((pCVar11->Freq < 0x1f) && (uVar16 = (ulong)p->MinContext->Suffix, uVar16 != 0)) {
    pBVar12 = p->Base;
    if (*(short *)(pBVar12 + uVar16) == 1) {
      if (pBVar12[uVar16 + 3] < 0x20) {
        pBVar12[uVar16 + 3] = pBVar12[uVar16 + 3] + 1;
      }
    }
    else {
      pBVar22 = pBVar12 + *(uint *)(pBVar12 + uVar16 + 4);
      if (pBVar12[*(uint *)(pBVar12 + uVar16 + 4)] != pCVar11->Symbol) {
        do {
          pBVar21 = pBVar22;
          pBVar22 = pBVar21 + 6;
        } while (pBVar21[6] != pCVar11->Symbol);
        if (pBVar21[1] <= pBVar21[7]) {
          uVar4 = *(undefined2 *)(pBVar21 + 10);
          uVar9 = *(undefined4 *)pBVar22;
          *(undefined2 *)(pBVar21 + 10) = *(undefined2 *)(pBVar21 + 4);
          *(undefined4 *)pBVar22 = *(undefined4 *)pBVar21;
          *(undefined2 *)(pBVar21 + 4) = uVar4;
          *(undefined4 *)pBVar21 = uVar9;
          pBVar22 = pBVar21;
        }
      }
      if (pBVar22[1] < 0x73) {
        pBVar22[1] = pBVar22[1] + 2;
        *(short *)(pBVar12 + uVar16 + 2) = *(short *)(pBVar12 + uVar16 + 2) + 2;
      }
    }
  }
  if (p->OrderFall == 0) {
    pCVar17 = CreateSuccessors(p,1);
    p->MaxContext = pCVar17;
    p->MinContext = pCVar17;
    if (pCVar17 == (CTX_PTR_conflict)0x0) goto LAB_006032b8;
    *(int *)&p->FoundState->SuccessorLow = (int)pCVar17 - *(int *)&p->Base;
  }
  else {
    pBVar12 = p->Text;
    BVar2 = p->FoundState->Symbol;
    p->Text = pBVar12 + 1;
    *pBVar12 = BVar2;
    if (p->UnitsStart <= p->Text) {
LAB_006032b8:
      RestartModel(p);
      return;
    }
    iVar13 = (int)p->Base;
    uVar28 = (int)p->Text - iVar13;
    if (uStack_5c == 0) {
      *(uint *)&p->FoundState->SuccessorLow = uVar28;
      uStack_5c = *(int *)&p->MinContext - iVar13;
    }
    else {
      if (uStack_5c <= uVar28) {
        pCVar17 = CreateSuccessors(p,0);
        if (pCVar17 == (CTX_PTR_conflict)0x0) {
          RestartModel(p);
          return;
        }
        uStack_5c = (int)pCVar17 - *(int *)&p->Base;
      }
      puVar1 = &p->OrderFall;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        p->Text = p->Text + -(ulong)(p->MaxContext != p->MinContext);
        uVar28 = uStack_5c;
      }
    }
    pCVar15 = p->MinContext;
    pCVar29 = p->MaxContext;
    if (pCVar29 != pCVar15) {
      uVar5 = pCVar15->NumStats;
      bVar3 = p->FoundState->Freq;
      uVar6 = pCVar15->SummFreq;
      uVar20 = (uint)uVar5;
      do {
        uVar7 = pCVar29->NumStats;
        uVar16 = (ulong)uVar7;
        if (uVar7 == 1) {
          puVar18 = (undefined4 *)AllocUnits(p,0);
          if (puVar18 == (undefined4 *)0x0) {
            RestartModel(p);
          }
          else {
            *(undefined2 *)(puVar18 + 1) = *(undefined2 *)((long)&pCVar29->Stats + 2);
            *puVar18 = *(undefined4 *)&pCVar29->SummFreq;
            pCVar29->Stats = (int)puVar18 - *(int *)&p->Base;
            bVar14 = *(byte *)((long)puVar18 + 1) * '\x02';
            if (0x1d < *(byte *)((long)puVar18 + 1)) {
              bVar14 = 0x78;
            }
            *(byte *)((long)puVar18 + 1) = bVar14;
            pCVar29->SummFreq = (short)p->InitEsc + (ushort)(3 < uVar5) + (ushort)bVar14;
          }
          if (puVar18 == (undefined4 *)0x0) {
            return;
          }
        }
        else {
          if ((uVar7 & 1) == 0) {
            uVar30 = (ulong)(uint)(uVar7 >> 1);
            bVar14 = p->Units2Indx[(uVar7 >> 1) - 1];
            if (bVar14 != p->Units2Indx[uVar30]) {
              pvVar19 = AllocUnits(p,bVar14 + 1);
              if (pvVar19 == (void *)0x0) {
                RestartModel(p);
              }
              else {
                pBVar12 = p->Base;
                uVar10 = pCVar29->Stats;
                pCVar23 = (CPpmd_Void_Ref *)(pBVar12 + uVar10);
                lVar25 = 0;
                do {
                  *(undefined4 *)((long)pvVar19 + lVar25) = *(undefined4 *)((long)pCVar23 + lVar25);
                  *(undefined4 *)((long)pvVar19 + lVar25 + 4) =
                       *(undefined4 *)((long)pCVar23 + lVar25 + 4);
                  *(undefined4 *)((long)pvVar19 + lVar25 + 8) =
                       *(undefined4 *)((long)pCVar23 + lVar25 + 8);
                  lVar25 = lVar25 + 0xc;
                  uVar27 = (int)uVar30 - 1;
                  uVar30 = (ulong)uVar27;
                } while (uVar27 != 0);
                *pCVar23 = p->FreeList[bVar14];
                p->FreeList[bVar14] = uVar10;
                pCVar29->Stats = (int)pvVar19 - (int)pBVar12;
              }
              if (pvVar19 == (void *)0x0) {
                return;
              }
            }
          }
          pCVar29->SummFreq =
               pCVar29->SummFreq + (ushort)((uint)uVar7 * 2 < uVar20) +
               (ushort)((uint)pCVar29->SummFreq <= (uint)uVar7 * 8 && (uint)uVar7 * 4 <= uVar20) * 2
          ;
        }
        pCVar11 = p->FoundState;
        uVar8 = pCVar29->SummFreq;
        uVar10 = (uVar8 + 6) * (uint)pCVar11->Freq * 2;
        uVar27 = ((uint)uVar6 - (bVar3 + uVar20)) + 1 + (uint)uVar8;
        if (uVar10 < uVar27 * 6) {
          sVar26 = 3;
          sVar24 = ((ushort)(uVar27 < uVar10) - (ushort)(uVar10 < uVar27 * 4)) + 2;
        }
        else {
          sVar26 = ((-(ushort)(uVar10 < uVar27 * 0xc) - (ushort)(uVar10 < uVar27 * 9)) + 7) -
                   (ushort)(uVar10 < uVar27 * 0xf);
          sVar24 = sVar26;
        }
        pCVar29->SummFreq = sVar26 + uVar8;
        pBVar12 = p->Base;
        uVar10 = pCVar29->Stats;
        *(short *)(pBVar12 + uVar16 * 6 + (ulong)uVar10 + 2) = (short)uVar28;
        *(short *)(pBVar12 + uVar16 * 6 + (ulong)uVar10 + 4) = (short)(uVar28 >> 0x10);
        pBVar12[uVar16 * 6 + (ulong)uVar10] = pCVar11->Symbol;
        pBVar12[uVar16 * 6 + (ulong)uVar10 + 1] = (Byte)sVar24;
        pCVar29->NumStats = uVar7 + 1;
        pCVar29 = (CPpmd7_Context *)(pBVar12 + pCVar29->Suffix);
      } while (pCVar29 != p->MinContext);
    }
    p->MinContext = (CPpmd7_Context *)(p->Base + uStack_5c);
    p->MaxContext = (CPpmd7_Context *)(p->Base + uStack_5c);
  }
  return;
}

Assistant:

static void NextContext(CPpmd8 *p)
{
  CTX_PTR c = CTX(SUCCESSOR(p->FoundState));
  if (p->OrderFall == 0 && (Byte *)c >= p->UnitsStart)
    p->MinContext = p->MaxContext = c;
  else
  {
    UpdateModel(p);
    p->MinContext = p->MaxContext;
  }
}